

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_decoder.cc
# Opt level: O2

bool __thiscall draco::PointCloudDecoder::DecodePointAttributesStep1(PointCloudDecoder *this)

{
  pointer puVar1;
  AttributesDecoderInterface *pAVar2;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  _Var3;
  bool bVar4;
  char cVar5;
  int iVar6;
  ulong in_RAX;
  int i;
  ulong uVar7;
  unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  *att_dec;
  pointer puVar8;
  ulong uVar9;
  uint8_t tmp_num_attributes_decoders;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  bVar4 = DecoderBuffer::Decode<unsigned_char>(this->buffer_,(uchar *)((long)&uStack_28 + 7));
  uVar7 = 0;
  if (!bVar4) goto LAB_00129153;
  do {
    if ((uint)uStack_28._7_1_ <= (uint)uVar7) {
      puVar8 = (this->attributes_decoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (this->attributes_decoders_).
               super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      goto LAB_00129134;
    }
    iVar6 = (*this->_vptr_PointCloudDecoder[4])(this,uVar7);
    uVar7 = (ulong)((uint)uVar7 + 1);
  } while ((char)iVar6 != '\0');
  goto LAB_00129151;
  while( true ) {
    _Var3._M_t.
    super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
    .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
         (this->attributes_decoders_).
         super__Vector_base<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>,_std::allocator<std::unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar9]._M_t.
         super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
         ._M_t;
    cVar5 = (**(code **)(*(long *)_Var3._M_t.
                                  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                                  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>
                                  ._M_head_impl + 0x18))
                      (_Var3._M_t.
                       super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                       .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                       _M_head_impl,this->buffer_);
    uVar9 = uVar9 + 1;
    if (cVar5 == '\0') break;
LAB_00129163:
    bVar4 = uStack_28 >> 0x38 <= uVar9;
    uVar7 = (ulong)bVar4;
    if (bVar4) break;
  }
  goto LAB_00129153;
  while( true ) {
    pAVar2 = (puVar8->_M_t).
             super___uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
    iVar6 = (*pAVar2->_vptr_AttributesDecoderInterface[2])(pAVar2,this,this->point_cloud_);
    puVar8 = puVar8 + 1;
    if ((char)iVar6 == '\0') break;
LAB_00129134:
    if (puVar8 == puVar1) {
      uVar9 = 0;
      goto LAB_00129163;
    }
  }
LAB_00129151:
  uVar7 = 0;
LAB_00129153:
  return SUB81(uVar7,0);
}

Assistant:

bool PointCloudDecoder::DecodePointAttributesStep1() {

  uint8_t tmp_num_attributes_decoders;
  if (!buffer_->Decode(&tmp_num_attributes_decoders)) {
    return false;
  }
  // Create all attribute decoders. This is implementation specific and the
  // derived classes can use any data encoded in the
  // PointCloudEncoder::EncodeAttributesEncoderIdentifier() call.
  for (int i = 0; i < tmp_num_attributes_decoders; ++i) {
    if (!CreateAttributesDecoder(i)) {
      return false;
    }
  }

  // Initialize all attributes decoders. No data is decoded here.
  for (auto &att_dec : attributes_decoders_) {
    if (!att_dec->Init(this, point_cloud_)) {
      return false;
    }
  }

  // Decode any data needed by the attribute decoders.
  for (int i = 0; i < tmp_num_attributes_decoders; ++i) {
    if (!attributes_decoders_[i]->DecodeAttributesDecoderData(buffer_)) {
      return false;
    }
  }
  return true;
}